

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O2

bool duckdb::ApproxQuantileCoding::Decode<double,int>(double *source,int *target)

{
  bool bVar1;
  
  bVar1 = TryCast::Operation<double,int>(*source,target,false);
  if (!bVar1) {
    *target = (*source <= 0.0 && *source != 0.0) + 0x7fffffff;
  }
  return bVar1;
}

Assistant:

static bool Decode(const SAVE_TYPE &source, TARGET_TYPE &target) {
		// The result is approximate, so clamp instead of overflowing.
		if (TryCast::Operation(source, target, false)) {
			return true;
		} else if (source < 0) {
			target = NumericLimits<TARGET_TYPE>::Minimum();
		} else {
			target = NumericLimits<TARGET_TYPE>::Maximum();
		}
		return false;
	}